

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  bool bVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *functionBody;
  
  if ((funcInfo == (FuncInfo *)0x0) ||
     (functionBody = FuncInfo::GetParsedFunctionBody(funcInfo), functionBody == (FunctionBody *)0x0)
     ) {
    bVar1 = Js::Phases::IsEnabledForAll((Phases *)&DAT_01441eb0,NativeArrayPhase);
    if (bVar1) {
      return false;
    }
    bVar1 = true;
    functionBody = (FunctionBody *)0x0;
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,NativeArrayPhase,sourceContextId,functionId);
    if (bVar1) {
      return false;
    }
    bVar1 = false;
  }
  bVar2 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
  if (bVar2) {
    return false;
  }
  if (!bVar1) {
    bVar1 = Js::DynamicProfileInfo::IsEnabled(NativeArrayPhase,functionBody);
    return bVar1;
  }
  bVar1 = Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction
                    (NativeArrayPhase,byteCodeGenerator->scriptContext);
  return bVar1;
}

Assistant:

bool CreateNativeArrays(ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
#if ENABLE_PROFILE_INFO
    Js::FunctionBody *functionBody = funcInfo ? funcInfo->GetParsedFunctionBody() : nullptr;

    return
        !PHASE_OFF_OPTFUNC(Js::NativeArrayPhase, functionBody) &&
        !byteCodeGenerator->IsInDebugMode() &&
        (
            functionBody
                ? Js::DynamicProfileInfo::IsEnabled(Js::NativeArrayPhase, functionBody)
                : Js::DynamicProfileInfo::IsEnabledForAtLeastOneFunction(
                    Js::NativeArrayPhase,
                    byteCodeGenerator->GetScriptContext())
        );
#else
    return false;
#endif
}